

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

wchar_t terminal_gettc(EditLine *el,wchar_t argc,char **argv)

{
  termcapstr *ptVar1;
  int *piVar2;
  char *__s1;
  int iVar3;
  char *pcVar4;
  wchar_t wVar5;
  termcapstr *ptVar6;
  ulong uVar7;
  bool bVar8;
  
  wVar5 = L'\xffffffff';
  if (((argv != (char **)0x0) && (pcVar4 = argv[1], pcVar4 != (char *)0x0)) &&
     (piVar2 = (int *)argv[2], piVar2 != (int *)0x0)) {
    iVar3 = strcmp("al",pcVar4);
    ptVar6 = tstr;
    if (iVar3 == 0) {
      bVar8 = false;
    }
    else {
      do {
        ptVar1 = ptVar6 + 1;
        bVar8 = ptVar1->name == (char *)0x0;
        if (bVar8) goto LAB_00111b2b;
        ptVar6 = ptVar6 + 1;
        iVar3 = strcmp(ptVar1->name,pcVar4);
      } while (iVar3 != 0);
    }
    if (bVar8) {
LAB_00111b2b:
      iVar3 = strcmp("am",pcVar4);
      if (iVar3 == 0) {
        bVar8 = false;
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        do {
          __s1 = *(char **)((long)&tval[1].name + uVar7);
          bVar8 = __s1 == (char *)0x0;
          if (bVar8) {
            return L'\xffffffff';
          }
          iVar3 = strcmp(__s1,pcVar4);
          uVar7 = uVar7 + 0x10;
        } while (iVar3 != 0);
      }
      if (bVar8) {
        return L'\xffffffff';
      }
      iVar3 = *(int *)((long)(el->el_terminal).t_val + (uVar7 >> 2));
      if (uVar7 < 0x20 || (uVar7 & 0x7fffffffffffffd0) == 0x40) {
        pcVar4 = terminal_gettc::yes;
        if (iVar3 == 0) {
          pcVar4 = terminal_gettc::no;
        }
        *(char **)piVar2 = pcVar4;
      }
      else {
        *piVar2 = iVar3;
      }
    }
    else {
      *(undefined8 *)piVar2 =
           *(undefined8 *)((long)(el->el_terminal).t_str + ((long)(ptVar6 + -0x1307c) >> 1));
    }
    wVar5 = L'\0';
  }
  return wVar5;
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_gettc(EditLine *el, int argc __attribute__((__unused__)), char **argv)
{
	const struct termcapstr *ts;
	const struct termcapval *tv;
	char *what;
	void *how;

	if (argv == NULL || argv[1] == NULL || argv[2] == NULL)
		return -1;

	what = argv[1];
	how = argv[2];

	/*
         * Do the strings first
         */
	for (ts = tstr; ts->name != NULL; ts++)
		if (strcmp(ts->name, what) == 0)
			break;

	if (ts->name != NULL) {
		*(char **)how = el->el_terminal.t_str[ts - tstr];
		return 0;
	}
	/*
         * Do the numeric ones second
         */
	for (tv = tval; tv->name != NULL; tv++)
		if (strcmp(tv->name, what) == 0)
			break;

	if (tv->name == NULL)
		return -1;

	if (tv == &tval[T_pt] || tv == &tval[T_km] ||
	    tv == &tval[T_am] || tv == &tval[T_xn]) {
		static char yes[] = "yes";
		static char no[] = "no";
		if (el->el_terminal.t_val[tv - tval])
			*(char **)how = yes;
		else
			*(char **)how = no;
		return 0;
	} else {
		*(int *)how = el->el_terminal.t_val[tv - tval];
		return 0;
	}
}